

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall
QStandardItemPrivate::sortChildren(QStandardItemPrivate *this,int column,SortOrder order)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QStandardItem *pQVar5;
  iterator iVar6;
  iterator iVar7;
  qsizetype qVar8;
  const_reference ppVar9;
  const_reference piVar10;
  reference ppQVar11;
  QStandardItemModelPrivate *pQVar12;
  iterator o;
  QStandardItem **ppQVar13;
  int in_EDX;
  int in_ESI;
  QStandardItemPrivate *in_RDI;
  long in_FS_OFFSET;
  QStandardItem *itm_1;
  int c;
  int r;
  int i;
  QStandardItem *q;
  iterator it;
  QModelIndex to;
  QModelIndex from;
  QList<QStandardItem_*> sorted_children;
  QModelIndexList changedPersistentIndexesTo;
  QModelIndexList changedPersistentIndexesFrom;
  QStandardItemModelGreaterThan gt;
  QStandardItemModelLessThan lt;
  QStandardItem *itm;
  int row;
  QList<int> unsortable;
  QList<std::pair<QStandardItem_*,_int>_> sortable;
  parameter_type in_stack_fffffffffffffe68;
  QStandardItem *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  QAbstractItemModel *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  int local_140;
  int local_138;
  qsizetype in_stack_fffffffffffffed8;
  int iVar14;
  iterator local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  QModelIndexWrapper local_c8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  QStandardItemModelGreaterThan local_4a;
  QStandardItemModelLessThan local_49;
  QStandardItem *local_48;
  int local_3c;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QList<std::pair<QStandardItem_*,_int>_> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = q_func(in_RDI);
  iVar14 = in_ESI;
  iVar2 = columnCount(in_RDI);
  if (in_ESI < iVar2) {
    local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.ptr = (pair<QStandardItem_*,_int> *)&DAT_aaaaaaaaaaaaaaaa;
    local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<std::pair<QStandardItem_*,_int>_>::QList
              ((QList<std::pair<QStandardItem_*,_int>_> *)0x8ce26a);
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    local_28 = &DAT_aaaaaaaaaaaaaaaa;
    QList<int>::QList((QList<int> *)0x8ce2a4);
    rowCount(in_RDI);
    QList<std::pair<QStandardItem_*,_int>_>::reserve
              ((QList<std::pair<QStandardItem_*,_int>_> *)
               CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
               in_stack_fffffffffffffed8);
    rowCount(in_RDI);
    QList<int>::reserve((QList<int> *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                        in_stack_fffffffffffffed8);
    local_3c = 0;
    while (iVar2 = local_3c, iVar3 = rowCount(in_RDI), iVar2 < iVar3) {
      local_48 = QStandardItem::child
                           ((QStandardItem *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                            (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                            (int)in_stack_fffffffffffffe70);
      if (local_48 == (QStandardItem *)0x0) {
        QList<int>::append((QList<int> *)0x8ce363,
                           (parameter_type)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      }
      else {
        QList<std::pair<QStandardItem*,int>>::emplace_back<QStandardItem*&,int&>
                  ((QList<std::pair<QStandardItem_*,_int>_> *)in_stack_fffffffffffffe70,
                   (QStandardItem **)in_stack_fffffffffffffe68,(int *)0x8ce34d);
      }
      local_3c = local_3c + 1;
    }
    if (in_EDX == 0) {
      local_49 = (QStandardItemModelLessThan)0xaa;
      QStandardItemModelLessThan::QStandardItemModelLessThan(&local_49);
      iVar6 = QList<std::pair<QStandardItem_*,_int>_>::begin
                        ((QList<std::pair<QStandardItem_*,_int>_> *)in_stack_fffffffffffffe70);
      iVar7 = QList<std::pair<QStandardItem_*,_int>_>::end
                        ((QList<std::pair<QStandardItem_*,_int>_> *)in_stack_fffffffffffffe70);
      std::stable_sort<QList<std::pair<QStandardItem*,int>>::iterator,QStandardItemModelLessThan>
                (iVar6.i,iVar7.i);
    }
    else {
      local_4a = (QStandardItemModelGreaterThan)0xaa;
      QStandardItemModelGreaterThan::QStandardItemModelGreaterThan(&local_4a);
      iVar6 = QList<std::pair<QStandardItem_*,_int>_>::begin
                        ((QList<std::pair<QStandardItem_*,_int>_> *)in_stack_fffffffffffffe70);
      iVar7 = QList<std::pair<QStandardItem_*,_int>_>::end
                        ((QList<std::pair<QStandardItem_*,_int>_> *)in_stack_fffffffffffffe70);
      std::stable_sort<QList<std::pair<QStandardItem*,int>>::iterator,QStandardItemModelGreaterThan>
                (iVar6.i,iVar7.i);
    }
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x8ce467);
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QModelIndex>::QList((QList<QModelIndex> *)0x8ce4a1);
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    QList<QStandardItem_*>::size(&in_RDI->children);
    QList<QStandardItem_*>::QList
              ((QList<QStandardItem_*> *)in_stack_fffffffffffffe70,
               (qsizetype)in_stack_fffffffffffffe68);
    local_138 = 0;
    while (iVar2 = local_138, iVar3 = rowCount(in_RDI), iVar2 < iVar3) {
      qVar8 = QList<std::pair<QStandardItem_*,_int>_>::size(&local_20);
      if (local_138 < qVar8) {
        ppVar9 = QList<std::pair<QStandardItem_*,_int>_>::at
                           ((QList<std::pair<QStandardItem_*,_int>_> *)in_stack_fffffffffffffe70,
                            (qsizetype)in_stack_fffffffffffffe68);
        iVar2 = ppVar9->second;
      }
      else {
        in_stack_fffffffffffffe80 = (QAbstractItemModel *)(long)local_138;
        QList<std::pair<QStandardItem_*,_int>_>::size(&local_20);
        piVar10 = QList<int>::at((QList<int> *)in_stack_fffffffffffffe70,
                                 (qsizetype)in_stack_fffffffffffffe68);
        iVar2 = *piVar10;
      }
      local_140 = 0;
      while (iVar3 = local_140, iVar4 = columnCount(in_RDI), iVar3 < iVar4) {
        in_stack_fffffffffffffe70 =
             QStandardItem::child
                       ((QStandardItem *)CONCAT44(iVar3,in_stack_fffffffffffffe78),
                        (int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                        (int)in_stack_fffffffffffffe70);
        childIndex((QStandardItemPrivate *)CONCAT44(iVar2,in_stack_fffffffffffffe88),
                   (int)((ulong)in_stack_fffffffffffffe80 >> 0x20),(int)in_stack_fffffffffffffe80);
        ppQVar11 = QList<QStandardItem_*>::operator[]
                             ((QList<QStandardItem_*> *)in_stack_fffffffffffffe70,
                              (qsizetype)in_stack_fffffffffffffe68);
        *ppQVar11 = in_stack_fffffffffffffe70;
        if (in_RDI->model != (QStandardItemModel *)0x0) {
          local_b0 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          local_a0.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          QAbstractItemModel::createIndex
                    (in_stack_fffffffffffffe80,iVar3,in_stack_fffffffffffffe78,
                     in_stack_fffffffffffffe70);
          pQVar12 = QStandardItemModel::d_func((QStandardItemModel *)0x8ce674);
          in_stack_fffffffffffffe68 = (parameter_type)&pQVar12->field_0x90;
          QtPrivate::QModelIndexWrapper::QModelIndexWrapper(&local_c8,(QModelIndex *)&local_b0);
          bVar1 = QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>::contains
                            ((QMultiHash<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>
                              *)CONCAT44(iVar3,in_stack_fffffffffffffe78),
                             (QModelIndexWrapper *)in_stack_fffffffffffffe70);
          if (bVar1) {
            local_e0 = &DAT_aaaaaaaaaaaaaaaa;
            local_d8 = &DAT_aaaaaaaaaaaaaaaa;
            local_d0 = &DAT_aaaaaaaaaaaaaaaa;
            QAbstractItemModel::createIndex
                      (in_stack_fffffffffffffe80,iVar3,in_stack_fffffffffffffe78,
                       in_stack_fffffffffffffe70);
            QList<QModelIndex>::append
                      ((QList<QModelIndex> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
            QList<QModelIndex>::append
                      ((QList<QModelIndex> *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          }
        }
        local_140 = local_140 + 1;
      }
      local_138 = local_138 + 1;
    }
    QList<QStandardItem_*>::operator=
              ((QList<QStandardItem_*> *)in_stack_fffffffffffffe70,
               (QList<QStandardItem_*> *)in_stack_fffffffffffffe68);
    if (in_RDI->model != (QStandardItemModel *)0x0) {
      QAbstractItemModel::changePersistentIndexList
                ((QList_conflict3 *)in_RDI->model,(QList_conflict3 *)&local_68);
    }
    local_e8.i = (QStandardItem **)&DAT_aaaaaaaaaaaaaaaa;
    QList<QStandardItem_*>::iterator::iterator(&local_e8);
    local_e8 = QList<QStandardItem_*>::begin((QList<QStandardItem_*> *)in_stack_fffffffffffffe70);
    while( true ) {
      o = QList<QStandardItem_*>::end((QList<QStandardItem_*> *)in_stack_fffffffffffffe70);
      bVar1 = QList<QStandardItem_*>::iterator::operator!=(&local_e8,o);
      if (!bVar1) break;
      ppQVar13 = QList<QStandardItem_*>::iterator::operator*(&local_e8);
      if (*ppQVar13 != (QStandardItem *)0x0) {
        QList<QStandardItem_*>::iterator::operator*(&local_e8);
        QStandardItem::d_func((QStandardItem *)0x8ce81f);
        sortChildren((QStandardItemPrivate *)CONCAT44(iVar14,in_EDX),(int)((ulong)pQVar5 >> 0x20),
                     (SortOrder)pQVar5);
      }
      QList<QStandardItem_*>::iterator::operator++(&local_e8);
    }
    QList<QStandardItem_*>::~QList((QList<QStandardItem_*> *)0x8ce853);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8ce860);
    QList<QModelIndex>::~QList((QList<QModelIndex> *)0x8ce86d);
    QList<int>::~QList((QList<int> *)0x8ce87a);
    QList<std::pair<QStandardItem_*,_int>_>::~QList
              ((QList<std::pair<QStandardItem_*,_int>_> *)0x8ce887);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QStandardItemPrivate::sortChildren(int column, Qt::SortOrder order)
{
    Q_Q(QStandardItem);
    if (column >= columnCount())
        return;

    QList<std::pair<QStandardItem*, int> > sortable;
    QList<int> unsortable;

    sortable.reserve(rowCount());
    unsortable.reserve(rowCount());

    for (int row = 0; row < rowCount(); ++row) {
        QStandardItem *itm = q->child(row, column);
        if (itm)
            sortable.emplace_back(itm, row);
        else
            unsortable.append(row);
    }

    if (order == Qt::AscendingOrder) {
        QStandardItemModelLessThan lt;
        std::stable_sort(sortable.begin(), sortable.end(), lt);
    } else {
        QStandardItemModelGreaterThan gt;
        std::stable_sort(sortable.begin(), sortable.end(), gt);
    }

    QModelIndexList changedPersistentIndexesFrom, changedPersistentIndexesTo;
    QList<QStandardItem*> sorted_children(children.size());
    for (int i = 0; i < rowCount(); ++i) {
        int r = (i < sortable.size()
                 ? sortable.at(i).second
                 : unsortable.at(i - sortable.size()));
        for (int c = 0; c < columnCount(); ++c) {
            QStandardItem *itm = q->child(r, c);
            sorted_children[childIndex(i, c)] = itm;
            if (model) {
                QModelIndex from = model->createIndex(r, c, q);
                if (model->d_func()->persistent.indexes.contains(from)) {
                    QModelIndex to = model->createIndex(i, c, q);
                    changedPersistentIndexesFrom.append(from);
                    changedPersistentIndexesTo.append(to);
                }
            }
        }
    }

    children = sorted_children;

    if (model) {
        model->changePersistentIndexList(changedPersistentIndexesFrom, changedPersistentIndexesTo);
    }

    QList<QStandardItem*>::iterator it;
    for (it = children.begin(); it != children.end(); ++it) {
        if (*it)
            (*it)->d_func()->sortChildren(column, order);
    }
}